

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

void __thiscall TaskProviderSingleton::_run(TaskProviderSingleton *this,size_t taskCount)

{
  bool bVar1;
  __atomic_base<unsigned_long> *in_RSI;
  AbstractTaskProvider *in_RDI;
  size_t in_stack_00000030;
  AbstractTaskProvider *in_stack_00000038;
  ThreadPool *in_stack_00000040;
  
  bVar1 = AbstractTaskProvider::_ready(in_RDI);
  if ((bVar1) && (in_RSI != (__atomic_base<unsigned_long> *)0x0)) {
    std::__atomic_base<unsigned_long>::operator=(in_RSI,(__int_type)in_RDI);
    std::__atomic_base<unsigned_long>::operator=(in_RSI,(__int_type)in_RDI);
    std::__atomic_base<unsigned_long>::operator=(in_RSI,(__int_type)in_RDI);
    ThreadPoolMonoid::instance();
    std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)in_RDI);
    ThreadPool::add(in_stack_00000040,in_stack_00000038,in_stack_00000030);
  }
  return;
}

Assistant:

void TaskProviderSingleton::_run( size_t taskCount )
{
    if( _ready() && taskCount > 0 ) {
        _taskCount          = taskCount;
        _givenTaskCount     = 0;
        _completedTaskCount = 0;

        ThreadPoolMonoid::instance().add( this, _taskCount );
    }
}